

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

void __thiscall roaring::Roaring64Map::add(Roaring64Map *this,uint32_t x)

{
  roaring_bitmap_t *r;
  
  r = (roaring_bitmap_t *)lookupOrCreateInner(this,0);
  roaring_bitmap_add(r,x);
  return;
}

Assistant:

void add(uint32_t x) { lookupOrCreateInner(0).add(x); }